

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Jump(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  PClassActor *cls;
  FState *val;
  char *pcVar4;
  DObject *pDVar5;
  
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_003da2da:
      pcVar4 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003da2f3;
    }
    pDVar5 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if ((pDVar5 != (DObject *)0x0) &&
         (bVar1 = DObject::IsKindOf(pDVar5,AActor::RegistrationInfo.MyClass), !bVar1)) {
        pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003da2f3;
      }
    }
    else if (pDVar5 != (DObject *)0x0) goto LAB_003da2da;
    if (numparam == 1) goto LAB_003da2e3;
    if (param[1].field_0.field_3.Type != '\x03') goto LAB_003da2da;
    pDVar5 = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (pDVar5 == (DObject *)0x0) goto LAB_003da1e0;
      bVar1 = DObject::IsKindOf(pDVar5,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003da2f3;
      }
    }
    else {
      if (pDVar5 != (DObject *)0x0) goto LAB_003da2da;
LAB_003da1e0:
      pDVar5 = (DObject *)0x0;
    }
    if (2 < (uint)numparam) {
      if (param[2].field_0.field_3.Type == '\x03') {
        if (numparam == 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[3].field_0.field_3.Type == '\0') {
            if ((4 < (uint)numparam) &&
               ((iVar3 = param[3].field_0.i, 0xff < iVar3 ||
                (iVar2 = FRandom::operator()(&pr_cajump), iVar2 < iVar3)))) {
              if (numparam + -4 == 1) {
                iVar3 = 4;
              }
              else {
                iVar3 = FRandom::operator()(&pr_cajump);
                iVar3 = iVar3 % (numparam + -4) + 4;
              }
              if (iVar3 < numparam) {
                if (param[iVar3].field_0.field_3.Type == '\0') {
                  iVar3 = param[iVar3].field_0.i;
                  cls = (PClassActor *)DObject::GetClass(pDVar5);
                  val = FStateLabelStorage::GetState(&StateLabels,iVar3,cls,false);
                  if (numret < 1) {
                    return 0;
                  }
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0x49b,
                                  "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  goto LAB_003da2ba;
                }
                pcVar4 = "param[paramnum + jumpnum].Type == REGT_INT";
              }
              else {
                pcVar4 = "(paramnum + jumpnum) < numparam";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49a,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49d,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            val = (FState *)0x0;
LAB_003da2ba:
            VMReturn::SetPointer(ret,val,0);
            return 1;
          }
          pcVar4 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x493,
                      "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar4 = "param[paramnum].Type == REGT_POINTER";
      goto LAB_003da2f3;
    }
  }
LAB_003da2e3:
  pcVar4 = "(paramnum) < numparam";
LAB_003da2f3:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Jump)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(maxchance);

	paramnum++;		// Increment paramnum to point at the first jump target
	int count = numparam - paramnum;
	if (count > 0 && (maxchance >= 256 || pr_cajump() < maxchance))
	{
		int jumpnum = (count == 1 ? 0 : (pr_cajump() % count));
		PARAM_STATE_ACTION_AT(paramnum + jumpnum, jumpto);
		ACTION_RETURN_STATE(jumpto);
	}
	ACTION_RETURN_STATE(NULL);
}